

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O0

string * __thiscall
ninx::lexer::Reader::read_until_limiter_abi_cxx11_(string *__return_storage_ptr__,Reader *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator local_41;
  string local_40 [36];
  value_type_conflict local_1c;
  char local_1b;
  char local_1a;
  byte local_19;
  char current;
  char next_char;
  Reader *pRStack_18;
  bool line_started;
  Reader *this_local;
  
  pRStack_18 = this;
  this_local = (Reader *)__return_storage_ptr__;
  std::vector<char,_std::allocator<char>_>::clear(&this->buffer);
  local_19 = 0;
  do {
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(this->stream + *(long *)(*(long *)this->stream + -0x18)));
    if (!bVar1) {
LAB_001412ad:
      local_1c = '\0';
      std::vector<char,_std::allocator<char>_>::push_back(&this->buffer,&local_1c);
      pcVar3 = std::vector<char,_std::allocator<char>_>::data(&this->buffer);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar3,&local_41);
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      return __return_storage_ptr__;
    }
    local_1a = std::istream::peek();
    if (local_1a == '\\') {
      std::istream::get();
    }
    else {
      bVar1 = is_limiter(local_1a);
      if ((bVar1) && (local_1a != '-')) goto LAB_001412ad;
    }
    local_1b = std::istream::get();
    if (local_1b == -1) goto LAB_001412ad;
    if (local_1b == '-') {
      iVar2 = std::istream::peek();
      iVar2 = isdigit(iVar2);
      if (iVar2 == 0) {
        std::istream::seekg((long)this->stream,~_S_beg);
        goto LAB_001412ad;
      }
    }
    if (local_1b == '\n') {
      increment_line(this);
      local_19 = 1;
    }
    else {
      iVar2 = isspace((int)local_1b);
      if (iVar2 == 0) {
        local_19 = 0;
      }
    }
    if ((local_1b == '\n') || ((local_19 & 1) == 0)) {
      std::vector<char,_std::allocator<char>_>::push_back(&this->buffer,&local_1b);
    }
  } while( true );
}

Assistant:

std::string ninx::lexer::Reader::read_until_limiter() {
    this->buffer.clear();

    bool line_started {false};  // Used to discard indentations

    while (stream) {
        // Check if the next char is one of the limiting ones
        char next_char = static_cast<char>(stream.peek());
        if (next_char == '\\') {   // Escaping control
            stream.get();  // Discard the escaping char, and avoid limiter check so char is considered as text
        }else{
            if (is_limiter(next_char) && next_char != '-') {  // Exception is for negative number handling
                break;
            }
        }

        // Read the current char
        char current = static_cast<char>(stream.get());
        if (current == -1) {
            break;
        }

        if (current == '-' && !isdigit(stream.peek())) {  // Not a negative number, rollback
            this->stream.seekg(-1, std::ios_base::cur);
            break;
        }

        if (current == '\n') { // Increment the line count if a newline was found
            this->increment_line();
            line_started = true;
        }else{
            if (!isspace(current)) {
                line_started = false;
            }
        }

        // Allow newlines and chars only if they are not the first space ( indentation )
        if ( current == '\n' || !line_started ) {
            this->buffer.push_back(current);
        }
    }

    this->buffer.push_back(0);

    return std::move(std::string{buffer.data()});
}